

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

_Bool chck_buffer_read_int(void *i,chck_bits bits,chck_buffer *buf)

{
  byte local_9;
  
  if ((i != (void *)0x0) && (buf != (chck_buffer *)0x0)) {
    chck_buffer_read_int_cold_1();
    return (_Bool)(local_9 & 1);
  }
  __assert_fail("i && buf",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                ,0x120,"_Bool chck_buffer_read_int(void *, enum chck_bits, struct chck_buffer *)");
}

Assistant:

bool
chck_buffer_read_int(void *i, enum chck_bits bits, struct chck_buffer *buf)
{
   assert(i && buf);

   if (!valid_bits(bits))
      return false;

   if (unlikely(chck_buffer_read(i, bits, 1, buf) != 1))
      return false;

   if (!chck_buffer_native_endianess(buf))
      chck_bswap_single(i, bits);

   return true;
}